

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O0

RPCHelpMan * wallet::newkeypool(void)

{
  long lVar1;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  RPCExamples *in_stack_fffffffffffffcd8;
  RPCResult *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffffce0;
  RPCResult *this_00;
  string *args;
  string *methodname;
  allocator<char> *in_stack_fffffffffffffd18;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  allocator<char> *__s;
  RPCHelpMan *this_01;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd48;
  RPCHelpMan *result;
  undefined4 in_stack_fffffffffffffd58;
  Type in_stack_fffffffffffffd5c;
  RPCResult *in_stack_fffffffffffffd60;
  allocator<char> local_27c;
  allocator<char> local_27b;
  allocator<char> local_27a;
  undefined1 local_279 [9];
  pointer pRStack_270;
  undefined8 local_268;
  allocator<char> local_252;
  allocator<char> local_251 [25];
  _Alloc_hider local_238;
  size_type sStack_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  allocator<char> local_211 [49];
  RPCExamples *in_stack_fffffffffffffe20;
  RPCResults *in_stack_fffffffffffffe28;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe38;
  string *in_stack_fffffffffffffe40;
  RPCHelpMan *in_stack_fffffffffffffe48;
  RPCMethodImpl *in_stack_ffffffffffffff40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  skip_type_check = (undefined1)((ulong)local_211 >> 0x38);
  this_01 = in_RDI;
  result = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&this_01->m_name,(char *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  std::operator+((char *)this_01,in_stack_fffffffffffffd20);
  local_238._M_p = (pointer)0x0;
  sStack_230 = 0;
  local_228._M_allocated_capacity = 0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffcd8);
  __s = local_251;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&this_01->m_name,(char *)__s,in_stack_fffffffffffffd18);
  __a = &local_252;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(&this_01->m_name,(char *)__s,__a);
  local_279._1_8_ = (pointer)0x0;
  pRStack_270 = (pointer)0x0;
  local_268 = 0;
  methodname = (string *)(local_279 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffcd8);
  RPCResult::RPCResult
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,&result->m_name,
             in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,(bool)skip_type_check);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
             (RPCResult *)result);
  args = (string *)local_279;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(&this_01->m_name,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(&this_01->m_name,(char *)__s,__a);
  HelpExampleCli(methodname,args);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(&this_01->m_name,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(&this_01->m_name,(char *)__s,__a);
  HelpExampleRpc(methodname,args);
  std::operator+(methodname,args);
  RPCExamples::RPCExamples(in_stack_fffffffffffffcd8,(string *)0x17d5328);
  this = (RPCResult *)&stack0xfffffffffffffd60;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::newkeypool()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this,
             in_stack_fffffffffffffce0);
  this_00 = this;
  RPCHelpMan::RPCHelpMan
            (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
             in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
             in_stack_ffffffffffffff40);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_27c);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_27b);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_27a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)local_279);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult(this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_252);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_251);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_211);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan newkeypool()
{
    return RPCHelpMan{"newkeypool",
                "\nEntirely clears and refills the keypool.\n"
                "WARNING: On non-HD wallets, this will require a new backup immediately, to include the new keys.\n"
                "When restoring a backup of an HD wallet created before the newkeypool command is run, funds received to\n"
                "new addresses may not appear automatically. They have not been lost, but the wallet may not find them.\n"
                "This can be fixed by running the newkeypool command on the backup and then rescanning, so the wallet\n"
                "re-generates the required keys." +
            HELP_REQUIRING_PASSPHRASE,
                {},
                RPCResult{RPCResult::Type::NONE, "", ""},
                RPCExamples{
            HelpExampleCli("newkeypool", "")
            + HelpExampleRpc("newkeypool", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    LOCK(pwallet->cs_wallet);

    LegacyScriptPubKeyMan& spk_man = EnsureLegacyScriptPubKeyMan(*pwallet, true);
    spk_man.NewKeyPool();

    return UniValue::VNULL;
},
    };
}